

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

CheckedError __thiscall
flatbuffers::Parser::CheckClash
          (Parser *this,
          vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *fields,
          StructDef *struct_def,char *suffix,BaseType basetype)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  int iVar1;
  char *pcVar2;
  const_iterator cVar3;
  long *plVar4;
  long *plVar5;
  size_type *psVar6;
  Parser *pPVar7;
  ulong uVar8;
  undefined4 in_register_00000084;
  int in_R9D;
  ulong *puVar9;
  key_type local_b8;
  int local_94;
  Parser *local_90;
  string *local_88;
  _Base_ptr local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>_>
  *local_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_94 = in_R9D;
  local_90 = this;
  local_88 = (string *)fields;
  pcVar2 = (char *)strlen((char *)CONCAT44(in_register_00000084,basetype));
  plVar4 = (long *)(struct_def->super_Definition).name._M_dataplus._M_p;
  if (plVar4 != (long *)(struct_def->super_Definition).name._M_string_length) {
    local_78 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>_>
                *)(suffix + 200);
    local_80 = (_Base_ptr)(suffix + 0xd0);
    do {
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar4;
      uVar8 = (long)__rhs->_M_string_length - (long)pcVar2;
      if (pcVar2 <= (char *)__rhs->_M_string_length && uVar8 != 0) {
        iVar1 = std::__cxx11::string::compare((ulong)__rhs,uVar8,pcVar2);
        if ((iVar1 == 0) && (*(int *)(*plVar4 + 200) != 1)) {
          std::__cxx11::string::substr((ulong)&local_b8,(ulong)__rhs);
          cVar3 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>_>
                  ::find(local_78,&local_b8);
          if (cVar3._M_node == local_80) {
            puVar9 = (ulong *)0x0;
          }
          else {
            puVar9 = *(ulong **)(cVar3._M_node + 2);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          if ((puVar9 != (ulong *)0x0) && ((int)puVar9[0x19] == local_94)) {
            std::operator+(&local_50,"Field ",__rhs);
            plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
            plVar5 = plVar4 + 2;
            if ((long *)*plVar4 == plVar5) {
              local_60 = *plVar5;
              lStack_58 = plVar4[3];
              local_70 = &local_60;
            }
            else {
              local_60 = *plVar5;
              local_70 = (long *)*plVar4;
            }
            local_68 = plVar4[1];
            *plVar4 = (long)plVar5;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_70,*puVar9);
            pPVar7 = local_90;
            psVar6 = (size_type *)(plVar4 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar4 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar6) {
              local_b8.field_2._M_allocated_capacity = *psVar6;
              local_b8.field_2._8_8_ = plVar4[3];
              local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
            }
            else {
              local_b8.field_2._M_allocated_capacity = *psVar6;
              local_b8._M_dataplus._M_p = (pointer)*plVar4;
            }
            local_b8._M_string_length = plVar4[1];
            *plVar4 = (long)psVar6;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            Error(local_90,local_88);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
            }
            if (local_70 != &local_60) {
              operator_delete(local_70,local_60 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            goto LAB_001181dd;
          }
        }
      }
      plVar4 = plVar4 + 1;
    } while (plVar4 != (long *)(struct_def->super_Definition).name._M_string_length);
  }
  *(undefined2 *)&(local_90->super_ParserState).prev_cursor_ = 0;
  pPVar7 = local_90;
LAB_001181dd:
  return SUB82(pPVar7,0);
}

Assistant:

CheckedError Parser::CheckClash(std::vector<FieldDef *> &fields,
                                StructDef *struct_def, const char *suffix,
                                BaseType basetype) {
  auto len = strlen(suffix);
  for (auto it = fields.begin(); it != fields.end(); ++it) {
    auto &fname = (*it)->name;
    if (fname.length() > len &&
        fname.compare(fname.length() - len, len, suffix) == 0 &&
        (*it)->value.type.base_type != BASE_TYPE_UTYPE) {
      auto field =
          struct_def->fields.Lookup(fname.substr(0, fname.length() - len));
      if (field && field->value.type.base_type == basetype)
        return Error("Field " + fname +
                     " would clash with generated functions for field " +
                     field->name);
    }
  }
  return NoError();
}